

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_domain_logs.cc
# Opt level: O2

int __thiscall
aliyun::Cdn::DescribeCdnDomainLogs
          (Cdn *this,CdnDescribeCdnDomainLogsRequestType *req,
          CdnDescribeCdnDomainLogsResponseType *response,CdnErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  Int IVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  char *pcVar7;
  uint index;
  allocator<char> local_4ac;
  allocator<char> local_4ab;
  allocator<char> local_4aa;
  allocator<char> local_4a9;
  Value val;
  string local_490;
  undefined1 local_470 [32];
  _Alloc_hider local_450;
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  long local_430;
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  Value *local_3e8;
  string str_response;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_490);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar7,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeCdnDomainLogs",(allocator<char> *)&local_490);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)local_470);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)local_470);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)local_470);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->domain_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"DomainName",(allocator<char> *)local_470);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->domain_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->log_day)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"LogDay",(allocator<char> *)local_470);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->log_day);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"RegionId",(allocator<char> *)local_470);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,this->region_id_,(allocator<char> *)&local_490);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (CdnErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_470,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_470,anon_var_dwarf_df3b2 + 9,&local_4a9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_470);
        std::__cxx11::string::~string((string *)local_470);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_470,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_470,anon_var_dwarf_df3b2 + 9,&local_4aa);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_470);
        std::__cxx11::string::~string((string *)local_470);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_470,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_470,anon_var_dwarf_df3b2 + 9,&local_4ab);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_470);
        std::__cxx11::string::~string((string *)local_470);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_470,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_470,anon_var_dwarf_df3b2 + 9,&local_4ac);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_470);
        std::__cxx11::string::~string((string *)local_470);
      }
      if (response != (CdnDescribeCdnDomainLogsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"DomainLogModel");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"DomainLogModel");
          bVar1 = Json::Value::isMember(pVVar5,"DomainName");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"DomainName");
            Json::Value::asString_abi_cxx11_((string *)local_470,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->domain_log_model).domain_name,(string *)local_470);
            std::__cxx11::string::~string((string *)local_470);
          }
          bVar1 = Json::Value::isMember(pVVar5,"DomainLogDetails");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"DomainLogDetails");
            bVar1 = Json::Value::isMember(pVVar6,"DomainLogDetail");
            if (bVar1) {
              pVVar5 = Json::Value::operator[](pVVar5,"DomainLogDetails");
              pVVar5 = Json::Value::operator[](pVVar5,"DomainLogDetail");
              bVar1 = Json::Value::isArray(pVVar5);
              if (bVar1) {
                local_3e8 = pVVar5;
                for (index = 0; pVVar5 = local_3e8, AVar3 = Json::Value::size(local_3e8),
                    index < AVar3; index = index + 1) {
                  local_470._0_8_ = local_470 + 0x10;
                  local_470._8_8_ = 0;
                  local_470[0x10] = '\0';
                  local_450._M_p = (pointer)&local_440;
                  local_448 = 0;
                  local_440._M_local_buf[0] = '\0';
                  local_428._M_p = (pointer)&local_418;
                  local_420 = 0;
                  local_418._M_local_buf[0] = '\0';
                  local_408._M_p = (pointer)&local_3f8;
                  local_400 = 0;
                  local_3f8._M_local_buf[0] = '\0';
                  pVVar5 = Json::Value::operator[](pVVar5,index);
                  bVar1 = Json::Value::isMember(pVVar5,"LogName");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"LogName");
                    Json::Value::asString_abi_cxx11_(&local_490,pVVar6);
                    std::__cxx11::string::operator=((string *)local_470,(string *)&local_490);
                    std::__cxx11::string::~string((string *)&local_490);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"LogPath");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"LogPath");
                    Json::Value::asString_abi_cxx11_(&local_490,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_450,(string *)&local_490);
                    std::__cxx11::string::~string((string *)&local_490);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"LogSize");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"LogSize");
                    IVar4 = Json::Value::asInt(pVVar6);
                    local_430 = (long)IVar4;
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"StartTime");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar5,"StartTime");
                    Json::Value::asString_abi_cxx11_(&local_490,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_428,(string *)&local_490);
                    std::__cxx11::string::~string((string *)&local_490);
                  }
                  bVar1 = Json::Value::isMember(pVVar5,"EndTime");
                  if (bVar1) {
                    pVVar5 = Json::Value::operator[](pVVar5,"EndTime");
                    Json::Value::asString_abi_cxx11_(&local_490,pVVar5);
                    std::__cxx11::string::operator=((string *)&local_408,(string *)&local_490);
                    std::__cxx11::string::~string((string *)&local_490);
                  }
                  std::
                  vector<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType,_std::allocator<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>_>
                  ::push_back((vector<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType,_std::allocator<aliyun::CdnDescribeCdnDomainLogsDomainLogDetailType>_>
                               *)response,(value_type *)local_470);
                  CdnDescribeCdnDomainLogsDomainLogDetailType::
                  ~CdnDescribeCdnDomainLogsDomainLogDetailType
                            ((CdnDescribeCdnDomainLogsDomainLogDetailType *)local_470);
                }
              }
            }
          }
        }
      }
      goto LAB_0012d639;
    }
  }
  iVar2 = -1;
  if (error_info != (CdnErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0012d639:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Cdn::DescribeCdnDomainLogs(const CdnDescribeCdnDomainLogsRequestType& req,
                      CdnDescribeCdnDomainLogsResponseType* response,
                       CdnErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeCdnDomainLogs");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.domain_name.empty()) {
    req_rpc->AddRequestQuery("DomainName", req.domain_name);
  }
  if(!req.log_day.empty()) {
    req_rpc->AddRequestQuery("LogDay", req.log_day);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}